

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QPointer<QWidget>>::emplace<QPointer<QWidget>const&>
          (QMovableArrayOps<QPointer<QWidget>> *this,qsizetype i,QPointer<QWidget> *args)

{
  Data *pDVar1;
  qsizetype qVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  Inserter local_60;
  QWeakPointer<QObject> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar2 = QArrayDataPointer<QPointer<QWidget>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<QPointer<QWidget>_> *)this);
      if (qVar2 != 0) {
        lVar4 = *(long *)(this + 8);
        lVar3 = *(long *)(this + 0x10);
        pDVar1 = (args->wp).d;
        *(Data **)(lVar4 + lVar3 * 0x10) = pDVar1;
        *(QObject **)(lVar4 + 8 + lVar3 * 0x10) = (args->wp).value;
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          *(int *)pDVar1 = *(int *)pDVar1 + 1;
          UNLOCK();
          lVar3 = *(long *)(this + 0x10);
        }
        *(long *)(this + 0x10) = lVar3 + 1;
        goto LAB_0042f9e7;
      }
    }
    if (i == 0) {
      qVar2 = QArrayDataPointer<QPointer<QWidget>_>::freeSpaceAtBegin
                        ((QArrayDataPointer<QPointer<QWidget>_> *)this);
      if (qVar2 != 0) {
        lVar4 = *(long *)(this + 8);
        pDVar1 = (args->wp).d;
        *(Data **)(lVar4 + -0x10) = pDVar1;
        *(QObject **)(lVar4 + -8) = (args->wp).value;
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          *(int *)pDVar1 = *(int *)pDVar1 + 1;
          UNLOCK();
          lVar4 = *(long *)(this + 8);
        }
        *(long *)(this + 8) = lVar4 + -0x10;
        *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
        goto LAB_0042f9e7;
      }
    }
  }
  local_38.d = (args->wp).d;
  local_38.value = (args->wp).value;
  if (local_38.d != (Data *)0x0) {
    LOCK();
    *(int *)local_38.d = *(int *)local_38.d + 1;
    UNLOCK();
  }
  lVar4 = *(long *)(this + 0x10);
  QArrayDataPointer<QPointer<QWidget>_>::detachAndGrow
            ((QArrayDataPointer<QPointer<QWidget>_> *)this,(uint)(i == 0 && lVar4 != 0),1,
             (QPointer<QWidget> **)0x0,(QArrayDataPointer<QPointer<QWidget>_> *)0x0);
  if (i == 0 && lVar4 != 0) {
    lVar4 = *(long *)(this + 8);
    *(Data **)(lVar4 + -0x10) = local_38.d;
    *(QObject **)(lVar4 + -8) = local_38.value;
    *(long *)(this + 8) = lVar4 + -0x10;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    QMovableArrayOps<QPointer<QWidget>_>::Inserter::Inserter
              (&local_60,(QArrayDataPointer<QPointer<QWidget>_> *)this,i,1);
    ((local_60.displaceFrom)->wp).d = local_38.d;
    ((local_60.displaceFrom)->wp).value = local_38.value;
    local_60.displaceFrom = local_60.displaceFrom + 1;
    (local_60.data)->size = (local_60.data)->size + local_60.nInserts;
  }
  local_38.value = (QObject *)0x0;
  local_38.d = (Data *)0x0;
  QWeakPointer<QObject>::~QWeakPointer(&local_38);
LAB_0042f9e7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }